

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
                     *lhs,Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *rhs,
               sub *func,false_type *param_5)

{
  PointerType pdVar1;
  long lVar2;
  PointerType pdVar3;
  void *pvVar4;
  undefined8 this;
  Scalar *ptr;
  ulong uVar5;
  long lVar6;
  Scalar *pSVar7;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
  *pBVar8;
  XprTypeNested *pXVar9;
  long lVar10;
  byte bVar11;
  Scalar SStack_148;
  Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>
  local_140;
  undefined1 local_a8 [40];
  ObjectType local_80;
  void *local_68;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,__1,_true>
  actual_lhs_wrapper;
  
  bVar11 = 0;
  pSVar7 = &SStack_148;
  uVar5 = (lhs->m_rhs).
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
          .m_rows.m_value * 8;
  if (uVar5 < 0x20001) {
    ptr = (Scalar *)((long)&SStack_148 - (uVar5 + 0x1e & 0xfffffffffffffff0));
    pSVar7 = ptr;
  }
  else {
    ptr = (Scalar *)0x0;
  }
  pdVar1 = (rhs->
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           ).
           super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  actual_lhs_wrapper._24_8_ = func;
  pSVar7[-1] = 6.7912089788496e-318;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_-1,_true>
  ::local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,__1,_true>
              *)&local_68,lhs,ptr);
  pvVar4 = local_68;
  lVar2 = (dst->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value;
  if (0 < lVar2) {
    lVar10 = 0;
    do {
      pdVar3 = (dst->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
               .m_data;
      local_140.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_rows.m_value =
           (dst->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
      local_140.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
      .m_data = pdVar3 + (((dst->
                           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                           ).
                           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                           .m_xpr.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                         .m_storage.m_rows * lVar10;
      if (local_140.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
          .m_rows.m_value < 0 && pdVar3 != (PointerType)0x0) {
        pSVar7[-1] = (Scalar)&LAB_0014fac1;
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>, Level = 0]"
                     );
      }
      pBVar8 = dst;
      pXVar9 = &local_140.
                super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
                .m_xpr;
      for (lVar6 = 0xd; this = actual_lhs_wrapper._24_8_, lVar6 != 0; lVar6 = lVar6 + -1) {
        (pXVar9->
        super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
        ).
        super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
        .m_data = (pBVar8->
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
                  .m_data;
        pBVar8 = (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                  *)((long)pBVar8 + ((ulong)bVar11 * -2 + 1) * 8);
        pXVar9 = (XprTypeNested *)((long)pXVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      }
      local_140.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .m_startRow.m_value = 0;
      local_140.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .m_outerStride =
           ((local_140.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
      local_140.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
      .m_startCol.m_value = lVar10;
      if ((dst->
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value <= lVar10) {
        pSVar7[-1] = 6.79281963285505e-318;
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if ((long)actual_lhs_wrapper.object._0_8_ < 0) {
        pSVar7[-1] = 6.79266647250484e-318;
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_a8._24_8_ = pdVar1[lVar10];
      local_a8._8_8_ = actual_lhs_wrapper.object._0_8_;
      local_a8._32_8_ = pvVar4;
      local_80._0_8_ = actual_lhs_wrapper.object._0_8_;
      local_80._8_1_ = actual_lhs_wrapper.object._8_1_;
      pSVar7[-1] = 6.79230580458337e-318;
      generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,false>const>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,5>
      ::sub::operator()((void *)this,&local_140,
                        (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>
                         *)local_a8);
      lVar10 = lVar10 + 1;
    } while (lVar2 != lVar10);
  }
  if (actual_lhs_wrapper.object._16_1_ == '\x01') {
    pSVar7[-1] = 6.79243920230775e-318;
    free(local_68);
  }
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}